

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  okim6295_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset < *(uint *)((long)info + 0xe0)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0xe0) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0xe0) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0xe8) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void okim6295_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	if (offset >= chip->ROMSize)
		return;
	if (offset + length > chip->ROMSize)
		length = chip->ROMSize - offset;
	
	memcpy(&chip->ROM[offset], data, length);
	
	return;
}